

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

void Abc_NtkOrderFaninsById(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char *pSop;
  int *piVar5;
  char *__dest;
  ulong __n;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *p;
  int *piVar9;
  void *pvVar10;
  Vec_Ptr_t *pVVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  char *__s;
  long lVar18;
  uint Entry;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x36,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar9 = (int *)malloc(400);
  p->pArray = piVar9;
  piVar9 = (int *)malloc(0x10);
  piVar9[0] = 100;
  piVar9[1] = 0;
  pvVar10 = malloc(100);
  *(void **)(piVar9 + 2) = pvVar10;
  pVVar11 = pNtk->vObjs;
  if (0 < pVVar11->nSize) {
    lVar18 = 0;
    do {
      pvVar10 = pVVar11->pArray[lVar18];
      if ((pvVar10 != (void *)0x0) && ((*(uint *)((long)pvVar10 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar10 + 0x38);
        uVar7 = Abc_SopGetVarNum(pSop);
        if (uVar7 != *(uint *)((long)pvVar10 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                        ,0x3d,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
        }
        p->nSize = 0;
        if (0 < (int)uVar7) {
          Entry = 0;
          do {
            Vec_IntPush(p,Entry);
            Entry = Entry + 1;
          } while (uVar7 != Entry);
        }
        piVar5 = p->pArray;
        __n = (ulong)uVar7;
        if (1 < (int)uVar7) {
          uVar14 = 1;
          uVar13 = 0;
          do {
            uVar1 = uVar13 + 1;
            uVar17 = uVar13 & 0xffffffff;
            uVar16 = uVar14;
            do {
              iVar8 = piVar5[uVar16];
              if (((long)iVar8 < 0) || (*(int *)((long)pvVar10 + 0x1c) <= iVar8)) {
LAB_00841a92:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar4 = piVar5[(int)uVar17];
              if (((long)iVar4 < 0) || (*(int *)((long)pvVar10 + 0x1c) <= iVar4)) goto LAB_00841a92;
              uVar6 = uVar16 & 0xffffffff;
              if (*(int *)(*(long *)((long)pvVar10 + 0x20) + (long)iVar4 * 4) <=
                  *(int *)(*(long *)((long)pvVar10 + 0x20) + (long)iVar8 * 4)) {
                uVar6 = uVar17;
              }
              uVar17 = uVar6;
              uVar16 = uVar16 + 1;
            } while (__n != uVar16);
            iVar8 = piVar5[uVar13];
            piVar5[uVar13] = piVar5[(int)uVar17];
            piVar5[(int)uVar17] = iVar8;
            uVar14 = uVar14 + 1;
            uVar13 = uVar1;
          } while (uVar1 != uVar7 - 1);
        }
        iVar8 = Abc_SopGetCubeNum(pSop);
        lVar15 = (long)(int)uVar7 + 3;
        iVar8 = iVar8 * (int)lVar15;
        if (*piVar9 <= iVar8) {
          iVar8 = iVar8 + 1;
          if (*(void **)(piVar9 + 2) == (void *)0x0) {
            pvVar12 = malloc((long)iVar8);
          }
          else {
            pvVar12 = realloc(*(void **)(piVar9 + 2),(long)iVar8);
          }
          *(void **)(piVar9 + 2) = pvVar12;
          *piVar9 = iVar8;
        }
        __dest = *(char **)(piVar9 + 2);
        iVar8 = Abc_SopGetCubeNum(pSop);
        memcpy(__dest,pSop,(long)(iVar8 * (int)lVar15 + 1));
        cVar3 = *__dest;
        __s = pSop;
        while (cVar3 != '\0') {
          if (0 < (int)uVar7) {
            memset(__s,0x2d,__n);
            uVar13 = 0;
            do {
              if ((__dest[piVar5[uVar13]] & 0xfeU) == 0x30) {
                __s[uVar13] = __dest[piVar5[uVar13]];
              }
              uVar13 = uVar13 + 1;
            } while (__n != uVar13);
          }
          __s = __s + lVar15;
          pcVar2 = __dest + lVar15;
          __dest = __dest + lVar15;
          cVar3 = *pcVar2;
        }
        *(char **)((long)pvVar10 + 0x38) = pSop;
        qsort(*(void **)((long)pvVar10 + 0x20),(long)*(int *)((long)pvVar10 + 0x1c),4,
              Vec_IntSortCompare1);
      }
      lVar18 = lVar18 + 1;
      pVVar11 = pNtk->vObjs;
    } while (lVar18 < pVVar11->nSize);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (*(void **)(piVar9 + 2) != (void *)0x0) {
    free(*(void **)(piVar9 + 2));
    piVar9[2] = 0;
    piVar9[3] = 0;
  }
  free(piVar9);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reorder fanins of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkOrderFaninsById( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, &pNode->vFanins );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, (size_t)(Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1) );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        Vec_IntSort( &pNode->vFanins, 0 );
//        Vec_IntPrint( vOrder );
    }
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}